

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O1

void __thiscall tetgenio::deinitialize(tetgenio *this)

{
  facet *pfVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (this->pointlist != (double *)0x0) {
    operator_delete__(this->pointlist);
  }
  if (this->pointattributelist != (double *)0x0) {
    operator_delete__(this->pointattributelist);
  }
  if (this->pointmtrlist != (double *)0x0) {
    operator_delete__(this->pointmtrlist);
  }
  if (this->pointmarkerlist != (int *)0x0) {
    operator_delete__(this->pointmarkerlist);
  }
  if (this->point2tetlist != (int *)0x0) {
    operator_delete__(this->point2tetlist);
  }
  if (this->pointparamlist != (pointparam *)0x0) {
    operator_delete__(this->pointparamlist);
  }
  if (this->tetrahedronlist != (int *)0x0) {
    operator_delete__(this->tetrahedronlist);
  }
  if (this->tetrahedronattributelist != (double *)0x0) {
    operator_delete__(this->tetrahedronattributelist);
  }
  if (this->tetrahedronvolumelist != (double *)0x0) {
    operator_delete__(this->tetrahedronvolumelist);
  }
  if (this->neighborlist != (int *)0x0) {
    operator_delete__(this->neighborlist);
  }
  if (this->tet2facelist != (int *)0x0) {
    operator_delete__(this->tet2facelist);
  }
  if (this->tet2edgelist != (int *)0x0) {
    operator_delete__(this->tet2edgelist);
  }
  if (this->trifacelist != (int *)0x0) {
    operator_delete__(this->trifacelist);
  }
  if (this->trifacemarkerlist != (int *)0x0) {
    operator_delete__(this->trifacemarkerlist);
  }
  if (this->o2facelist != (int *)0x0) {
    operator_delete__(this->o2facelist);
  }
  if (this->face2tetlist != (int *)0x0) {
    operator_delete__(this->face2tetlist);
  }
  if (this->face2edgelist != (int *)0x0) {
    operator_delete__(this->face2edgelist);
  }
  if (this->edgelist != (int *)0x0) {
    operator_delete__(this->edgelist);
  }
  if (this->edgemarkerlist != (int *)0x0) {
    operator_delete__(this->edgemarkerlist);
  }
  if (this->o2edgelist != (int *)0x0) {
    operator_delete__(this->o2edgelist);
  }
  if (this->edge2tetlist != (int *)0x0) {
    operator_delete__(this->edge2tetlist);
  }
  if (this->facetlist != (facet *)0x0) {
    if (0 < this->numberoffacets) {
      lVar5 = 0;
      do {
        pfVar1 = this->facetlist + lVar5;
        if (0 < this->facetlist[lVar5].numberofpolygons) {
          lVar3 = 0;
          lVar4 = 0;
          do {
            pvVar2 = *(void **)((long)&pfVar1->polygonlist->vertexlist + lVar3);
            if (pvVar2 != (void *)0x0) {
              operator_delete__(pvVar2);
            }
            lVar4 = lVar4 + 1;
            lVar3 = lVar3 + 0x10;
          } while (lVar4 < pfVar1->numberofpolygons);
        }
        if (pfVar1->polygonlist != (polygon *)0x0) {
          operator_delete__(pfVar1->polygonlist);
        }
        if (pfVar1->holelist != (double *)0x0) {
          operator_delete__(pfVar1->holelist);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->numberoffacets);
    }
    if (this->facetlist != (facet *)0x0) {
      operator_delete__(this->facetlist);
    }
  }
  if (this->facetmarkerlist != (int *)0x0) {
    operator_delete__(this->facetmarkerlist);
  }
  if (this->holelist != (double *)0x0) {
    operator_delete__(this->holelist);
  }
  if (this->regionlist != (double *)0x0) {
    operator_delete__(this->regionlist);
  }
  if (this->facetconstraintlist != (double *)0x0) {
    operator_delete__(this->facetconstraintlist);
  }
  if (this->segmentconstraintlist != (double *)0x0) {
    operator_delete__(this->segmentconstraintlist);
  }
  if (this->vpointlist != (double *)0x0) {
    operator_delete__(this->vpointlist);
  }
  if (this->vedgelist != (voroedge *)0x0) {
    operator_delete__(this->vedgelist);
  }
  if (this->vfacetlist != (vorofacet *)0x0) {
    if (0 < this->numberofvfacets) {
      lVar5 = 8;
      lVar3 = 0;
      do {
        pvVar2 = *(void **)((long)&this->vfacetlist->c1 + lVar5);
        if (pvVar2 != (void *)0x0) {
          operator_delete__(pvVar2);
        }
        lVar3 = lVar3 + 1;
        lVar5 = lVar5 + 0x10;
      } while (lVar3 < this->numberofvfacets);
    }
    if (this->vfacetlist != (vorofacet *)0x0) {
      operator_delete__(this->vfacetlist);
    }
  }
  if (this->vcelllist != (int **)0x0) {
    if (0 < this->numberofvcells) {
      lVar5 = 0;
      do {
        if (this->vcelllist[lVar5] != (int *)0x0) {
          operator_delete__(this->vcelllist[lVar5]);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->numberofvcells);
    }
    if (this->vcelllist != (int **)0x0) {
      operator_delete__(this->vcelllist);
      return;
    }
  }
  return;
}

Assistant:

void deinitialize()
  {
    int i, j;

    if (pointlist != (REAL *) NULL) {
      delete [] pointlist;
    }
    if (pointattributelist != (REAL *) NULL) {
      delete [] pointattributelist;
    }
    if (pointmtrlist != (REAL *) NULL) {
      delete [] pointmtrlist;
    }
    if (pointmarkerlist != (int *) NULL) {
      delete [] pointmarkerlist;
    }
	if (point2tetlist != (int *) NULL) {
      delete [] point2tetlist;
    }
    if (pointparamlist != (pointparam *) NULL) {
      delete [] pointparamlist;
    }

    if (tetrahedronlist != (int *) NULL) {
      delete [] tetrahedronlist;
    }
    if (tetrahedronattributelist != (REAL *) NULL) {
      delete [] tetrahedronattributelist;
    }
    if (tetrahedronvolumelist != (REAL *) NULL) {
      delete [] tetrahedronvolumelist;
    }
    if (neighborlist != (int *) NULL) {
      delete [] neighborlist;
    }
    if (tet2facelist != (int *) NULL) {
	  delete [] tet2facelist;
	}
	if (tet2edgelist != (int *) NULL) {
	  delete [] tet2edgelist;
	}

    if (trifacelist != (int *) NULL) {
      delete [] trifacelist;
    }
    if (trifacemarkerlist != (int *) NULL) {
      delete [] trifacemarkerlist;
    }
    if (o2facelist != (int *) NULL) {
      delete [] o2facelist;
    }
    if (face2tetlist != (int *) NULL) {
      delete [] face2tetlist;
    }
	if (face2edgelist != (int *) NULL) {
      delete [] face2edgelist;
    }

    if (edgelist != (int *) NULL) {
      delete [] edgelist;
    }
    if (edgemarkerlist != (int *) NULL) {
      delete [] edgemarkerlist;
    }
    if (o2edgelist != (int *) NULL) {
      delete [] o2edgelist;
    }
    if (edge2tetlist != (int *) NULL) {
      delete [] edge2tetlist;
    }

    if (facetlist != (facet *) NULL) {
      facet *f;
      polygon *p;
      for (i = 0; i < numberoffacets; i++) {
        f = &facetlist[i];
        for (j = 0; j < f->numberofpolygons; j++) {
          p = &f->polygonlist[j];
          delete [] p->vertexlist;
        }
        delete [] f->polygonlist;
        if (f->holelist != (REAL *) NULL) {
          delete [] f->holelist;
        }
      }
      delete [] facetlist;
    }
    if (facetmarkerlist != (int *) NULL) {
      delete [] facetmarkerlist;
    }

    if (holelist != (REAL *) NULL) {
      delete [] holelist;
    }
    if (regionlist != (REAL *) NULL) {
      delete [] regionlist;
    }
    if (facetconstraintlist != (REAL *) NULL) {
      delete [] facetconstraintlist;
    }
    if (segmentconstraintlist != (REAL *) NULL) {
      delete [] segmentconstraintlist;
    }
    if (vpointlist != (REAL *) NULL) {
      delete [] vpointlist;
    }
    if (vedgelist != (voroedge *) NULL) {
      delete [] vedgelist;
    }
    if (vfacetlist != (vorofacet *) NULL) {
      for (i = 0; i < numberofvfacets; i++) {
        delete [] vfacetlist[i].elist;
      }
      delete [] vfacetlist;
    }
    if (vcelllist != (int **) NULL) {
      for (i = 0; i < numberofvcells; i++) {
        delete [] vcelllist[i];
      }
      delete [] vcelllist;
    }
  }